

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgen.cc
# Opt level: O1

int main(int argc,char **argv)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Grammar *grammar_00;
  bool bVar2;
  long lVar3;
  int iVar4;
  char **in_RSI;
  char *pcVar5;
  int in_EDI;
  vector<Token,_std::allocator<Token>_> verbatim;
  Grammar *grammar;
  vector<Token,_std::allocator<Token>_> tokens;
  DisposeAST disposeAST;
  Parser parser;
  ofstream out;
  GenParser gen;
  int local_454;
  char **local_450;
  vector<Token,_std::allocator<Token>_> local_448;
  Grammar *local_430;
  vector<Token,_std::allocator<Token>_> local_428;
  string local_410;
  DisposeAST local_3f0;
  vector<Token,_std::allocator<Token>_> local_3e8;
  Parser local_3d0;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390 [14];
  ios_base local_2a8 [272];
  GenParser local_198;
  ios_base local_128 [264];
  
  local_454 = in_EDI;
  local_450 = in_RSI;
  local_3a0._0_8_ = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"1.0","");
  gflags::SetVersionString((string *)local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._0_8_ != local_390) {
    operator_delete((void *)local_3a0._0_8_,local_390[0]._M_allocated_capacity + 1);
  }
  local_3a0._0_8_ = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a0,"pgen [options] file","");
  gflags::SetUsageMessage((string *)local_3a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._0_8_ != local_390) {
    operator_delete((void *)local_3a0._0_8_,local_390[0]._M_allocated_capacity + 1);
  }
  gflags::ParseCommandLineFlags(&local_454,&local_450,true);
  args = fLS::FLAGS_input_abi_cxx11_;
  if ((fLS::FLAGS_input_abi_cxx11_->_M_string_length == 0) && (1 < local_454)) {
    pcVar5 = local_450[1];
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)args,0,(char *)0x0,(ulong)pcVar5);
  }
  psVar1 = fLS::FLAGS_o_abi_cxx11_;
  if (args->_M_string_length == 0) {
    lVar3 = 0x13;
    pcVar5 = "pgen: no input file";
  }
  else {
    if (*(long *)(fLS::FLAGS_o_abi_cxx11_ + 8) != 0) {
      local_448.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_448.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_448.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::ifstream::ifstream(local_3a0,(string *)args,_S_in);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      std::ostream::operator<<((ostream *)&local_198,(streambuf *)local_390[0]._M_local_buf);
      std::ifstream::close();
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
      std::ios_base::~ios_base(local_128);
      std::ifstream::~ifstream(local_3a0);
      Lexer::tokenize(&local_428,&local_410,&local_448);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      std::vector<Token,_std::allocator<Token>_>::vector(&local_3e8,&local_428);
      local_3d0.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_3e8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_3d0.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3e8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3d0.tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_3e8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_3e8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_3e8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_3e8.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_3d0.grammar_ = (Grammar *)0x0;
      local_3d0.yyinvalid = true;
      local_3d0.yytok = 0;
      local_3d0.yydepth = -1;
      local_3d0.yycursor = 0;
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_3e8);
      local_430 = (Grammar *)0x0;
      bVar2 = Parser::parse_grammar(&local_3d0,&local_430);
      grammar_00 = local_430;
      if (bVar2) {
        iVar4 = 1;
        if ((local_430->undef)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          std::ofstream::ofstream(local_3a0,psVar1,_S_out);
          GenParser::GenParser(&local_198,(ostream *)local_3a0);
          GenParser::operator()(&local_198,grammar_00,&local_448);
          local_3f0.super_Visitor._vptr_Visitor = (Visitor)&PTR__Visitor_00137cb8;
          ast::DisposeAST::operator()(&local_3f0,&grammar_00->super_Node);
          local_3a0._0_8_ = _VTT;
          *(undefined8 *)(local_3a0 + *(long *)(_VTT->_M_local_buf + -0x18)) =
               ___throw_bad_array_new_length;
          std::filebuf::~filebuf((filebuf *)(local_3a0 + 8));
          std::ios_base::~ios_base(local_2a8);
          iVar4 = 0;
        }
      }
      else {
        fmt::v7::print<char[33],std::__cxx11::string&,int&,char>
                  ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
                   (char (*) [33])"{0}:{1}: error: unexpected token",args,
                   &local_428.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                    super__Vector_impl_data._M_start[local_3d0.yycursor].line);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        iVar4 = 1;
        std::ostream::flush();
      }
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_3d0.tokens);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_428);
      std::vector<Token,_std::allocator<Token>_>::~vector(&local_448);
      goto LAB_0010f65f;
    }
    lVar3 = 0x14;
    pcVar5 = "pgen: no output file";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
  std::ostream::put(' ');
  iVar4 = 1;
  std::ostream::flush();
LAB_0010f65f:
  gflags::ShutDownCommandLineFlags();
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]) {
  FlagsScope flagsScope;

  gflags::SetVersionString("1.0");
  gflags::SetUsageMessage("pgen [options] file");
  gflags::ParseCommandLineFlags(&argc, &argv, true);

  if (FLAGS_input.empty() && argc > 1) FLAGS_input = argv[1];

  if (FLAGS_input.empty()) {
    std::cerr << "pgen: no input file" << std::endl;
    return EXIT_FAILURE;
  }

  if (FLAGS_o.empty()) {
    std::cerr << "pgen: no output file" << std::endl;
    return EXIT_FAILURE;
  }

  std::vector<Token> verbatim;

  std::vector<Token> tokens = Lexer::tokenize(ReadFile(FLAGS_input), &verbatim);

  Parser parser(tokens);

  ast::Grammar* grammar = nullptr;
  if (!parser.parse_grammar(grammar)) {
    fmt::print(std::cerr, "{0}:{1}: error: unexpected token", FLAGS_input,
               tokens[parser.yycursor].line);
    std::cerr << std::endl;
    return EXIT_FAILURE;
  }

  if (!grammar->undef.empty()) {
    return EXIT_FAILURE;
  }

  std::ofstream out(FLAGS_o);

  GenParser gen(out);
  gen(grammar, verbatim);

  ast::DisposeAST disposeAST;
  disposeAST(grammar);

  return EXIT_SUCCESS;
}